

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::ipc::ClientImpl::TryConnect(ClientImpl *this)

{
  char *__s;
  allocator<char> local_39;
  string local_38;
  undefined1 local_18 [16];
  ClientImpl *this_local;
  
  __s = this->socket_name_;
  local_18._8_8_ = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_39);
  perfetto::base::UnixSocket::Connect
            ((UnixSocket *)local_18,&local_38,&this->super_EventListener,this->task_runner_,kUnix,
             kStream,kIgnore);
  std::unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
  operator=(&this->sock_,
            (unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
             *)local_18);
  std::unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>::
  ~unique_ptr((unique_ptr<perfetto::base::UnixSocket,_std::default_delete<perfetto::base::UnixSocket>_>
               *)local_18);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void ClientImpl::TryConnect() {
  PERFETTO_DCHECK(socket_name_);
  sock_ = base::UnixSocket::Connect(socket_name_, this, task_runner_,
                                    kClientSockFamily, base::SockType::kStream,
                                    base::SockPeerCredMode::kIgnore);
}